

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O0

void __thiscall
Catch::BinaryExpr<unsigned_int,_int>::streamReconstructedExpression
          (BinaryExpr<unsigned_int,_int> *this,ostream *os)

{
  StringRef op;
  uint *in_RSI;
  long in_RDI;
  string local_68 [8];
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  ostream *in_stack_ffffffffffffffb0;
  char *pcVar1;
  size_type sVar2;
  string local_30 [48];
  
  Detail::stringify<unsigned_int>(in_RSI);
  pcVar1 = *(char **)(in_RDI + 0x10);
  sVar2 = *(size_type *)(in_RDI + 0x18);
  Detail::stringify<int>((int *)in_RSI);
  op.m_size = sVar2;
  op.m_start = pcVar1;
  formatReconstructedExpression
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,op,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }